

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O2

void __thiscall
Assimp::SplitByBoneCountProcess::Execute(SplitByBoneCountProcess *this,aiScene *pScene)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  aiMesh *paVar1;
  Logger *pLVar2;
  ostream *poVar3;
  aiMesh **__dest;
  uint a;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint local_1f4;
  SplitByBoneCountProcess *local_1f0;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *srcMesh;
  aiScene *local_1b0;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> newMeshes;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"SplitByBoneCountProcess begin");
  bVar6 = false;
  for (uVar4 = 0; pScene->mNumMeshes != uVar4; uVar4 = uVar4 + 1) {
    bVar6 = (bool)(bVar6 | this->mMaxBoneCount < (ulong)pScene->mMeshes[uVar4]->mNumBones);
  }
  local_1f0 = this;
  if (bVar6) {
    this_00 = &this->mSubMeshIndices;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::clear(this_00);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(this_00,(ulong)pScene->mNumMeshes);
    meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1b0 = pScene;
    for (uVar4 = 0; uVar4 < pScene->mNumMeshes; uVar4 = uVar4 + 1) {
      srcMesh = pScene->mMeshes[uVar4];
      newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SplitMesh(local_1f0,pScene->mMeshes[uVar4],&newMeshes);
      if (newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_1f4 = (uint)((ulong)((long)meshes.
                                         super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)meshes.
                                        super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((this_00->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar4,&local_1f4);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&meshes,&srcMesh);
      }
      else {
        for (uVar5 = 0; paVar1 = srcMesh,
            (ulong)uVar5 <
            (ulong)((long)newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
          local_1f4 = (uint)((ulong)((long)meshes.
                                           super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)meshes.
                                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((this_00->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar4,&local_1f4);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    (&meshes,newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar5);
        }
        if (srcMesh != (aiMesh *)0x0) {
          aiMesh::~aiMesh(srcMesh);
        }
        operator_delete(paVar1,0x520);
        pScene = local_1b0;
      }
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&newMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
    }
    uVar5 = (uint)((ulong)((long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    pScene->mNumMeshes = uVar5;
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
      uVar5 = pScene->mNumMeshes;
    }
    __dest = (aiMesh **)operator_new__((ulong)uVar5 << 3);
    pScene->mMeshes = __dest;
    if ((long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memmove(__dest,meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
              (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
    }
    UpdateNode(local_1f0,pScene->mRootNode);
    pLVar2 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&newMeshes);
    std::operator<<((ostream *)&newMeshes,"SplitByBoneCountProcess end: split ");
    std::ostream::_M_insert<unsigned_long>((ulong)&newMeshes);
    std::operator<<((ostream *)&newMeshes," meshes into ");
    std::ostream::_M_insert<unsigned_long>((ulong)&newMeshes);
    std::operator<<((ostream *)&newMeshes," submeshes.");
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar2,(char *)srcMesh);
    std::__cxx11::string::~string((string *)&srcMesh);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&newMeshes);
    std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
              (&meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  }
  else {
    pLVar2 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&newMeshes);
    std::operator<<((ostream *)&newMeshes,
                    "SplitByBoneCountProcess early-out: no meshes with more than ");
    poVar3 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &newMeshes,&this->mMaxBoneCount);
    std::operator<<(poVar3," bones.");
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar2,(char *)srcMesh);
    std::__cxx11::string::~string((string *)&srcMesh);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&newMeshes);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("SplitByBoneCountProcess begin");

    // early out
    bool isNecessary = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
        if( pScene->mMeshes[a]->mNumBones > mMaxBoneCount )
            isNecessary = true;

    if( !isNecessary )
    {
        ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess early-out: no meshes with more than " << mMaxBoneCount << " bones." );
        return;
    }

    // we need to do something. Let's go.
    mSubMeshIndices.clear();
    mSubMeshIndices.resize( pScene->mNumMeshes);

    // build a new array of meshes for the scene
    std::vector<aiMesh*> meshes;

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
    {
        aiMesh* srcMesh = pScene->mMeshes[a];

        std::vector<aiMesh*> newMeshes;
        SplitMesh( pScene->mMeshes[a], newMeshes);

        // mesh was split
        if( !newMeshes.empty() )
        {
            // store new meshes and indices of the new meshes
            for( unsigned int b = 0; b < newMeshes.size(); ++b)
            {
                mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
                meshes.push_back( newMeshes[b]);
            }

            // and destroy the source mesh. It should be completely contained inside the new submeshes
            delete srcMesh;
        }
        else
        {
            // Mesh is kept unchanged - store it's new place in the mesh array
            mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
            meshes.push_back( srcMesh);
        }
    }

    // rebuild the scene's mesh array
    pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    delete [] pScene->mMeshes;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

    // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
    UpdateNode( pScene->mRootNode);

    ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess end: split " << mSubMeshIndices.size() << " meshes into " << meshes.size() << " submeshes." );
}